

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

int ma_wcscpy_s(wchar_t *dst,size_t dstCap,wchar_t *src)

{
  int iVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  
  if (dst == (wchar_t *)0x0) {
    return 0x16;
  }
  if (dstCap == 0) {
    return 0x22;
  }
  pwVar2 = dst;
  if (src == (wchar_t *)0x0) {
    iVar1 = 0x16;
  }
  else {
    iVar1 = 0;
    sVar3 = 0;
    do {
      if (src[sVar3] == L'\0') goto LAB_00134691;
      *pwVar2 = src[sVar3];
      sVar3 = sVar3 + 1;
      pwVar2 = pwVar2 + 1;
    } while (dstCap != sVar3);
    iVar1 = 0x22;
    pwVar2 = dst;
  }
LAB_00134691:
  *pwVar2 = L'\0';
  return iVar1;
}

Assistant:

MA_API MA_NO_INLINE int ma_wcscpy_s(wchar_t* dst, size_t dstCap, const wchar_t* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstCap == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstCap && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstCap) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}